

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typedisplay.cc
# Opt level: O1

bool __thiscall
Typelib::TypeDisplayVisitor::visit_(TypeDisplayVisitor *this,Compound *type,Field *field)

{
  ostream *poVar1;
  string local_40;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(+",2);
  Field::getOffset(field);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
  TypeVisitor::visit_(&this->super_TypeVisitor,type,field);
  poVar1 = this->m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  Field::getName_abi_cxx11_(&local_40,field);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool TypeDisplayVisitor::visit_(Compound const& type, Field const& field)
{
    m_stream << m_indent << "(+" << field.getOffset() << ") ";
    TypeVisitor::visit_(type, field);
    m_stream << " " << field.getName() << std::endl;
    return true;
}